

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ss_mintrosort(uchar *T,int *PA,int *first,int *last,int depth)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  int *in_RCX;
  int iVar7;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar8;
  int x;
  int v;
  int limit;
  int ssize;
  int t;
  int s;
  int *f;
  int *e;
  int *d;
  int *c;
  int *b;
  int *a;
  uchar *Td;
  anon_struct_24_4_d8a55aef stack [16];
  int *local_208;
  int depth_00;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int *in_stack_fffffffffffffe20;
  int *piVar9;
  int *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  int *local_1b8;
  undefined8 local_1a8 [2];
  int aiStack_198 [93];
  int local_24;
  int *local_20;
  int *local_18;
  int *local_10;
  long local_8;
  
  bVar1 = 0;
  depth_00 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = ss_ilg((int)((long)in_RCX - (long)in_RDX >> 2));
  do {
    while( true ) {
      while ((long)local_20 - (long)local_18 >> 2 < 9) {
        if (1 < (long)local_20 - (long)local_18 >> 2) {
          ss_insertionsort((uchar *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,
                           (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           depth_00);
        }
        if (depth_00 < 0) {
          __assert_fail("0 <= ssize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb65e,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        if (depth_00 == 0) {
          return;
        }
        depth_00 = depth_00 + -1;
        local_18 = (int *)local_1a8[(long)depth_00 * 3];
        local_20 = (int *)local_1a8[(long)depth_00 * 3 + 1];
        local_24 = aiStack_198[(long)depth_00 * 6];
        iVar3 = aiStack_198[(long)depth_00 * 6 + 1];
      }
      lVar4 = local_8 + local_24;
      iVar6 = iVar3 + -1;
      bVar8 = iVar3 == 0;
      iVar3 = iVar6;
      if (bVar8) {
        ss_heapsort((uchar *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        iVar3 = iVar6;
      }
      if (iVar3 < 0) break;
      piVar5 = ss_pivot((uchar *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                        (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        (int *)CONCAT44(depth_00,iVar3));
      bVar2 = *(byte *)(lVar4 + local_10[*piVar5]);
      in_stack_fffffffffffffe18 = *local_18;
      *local_18 = *piVar5;
      *piVar5 = in_stack_fffffffffffffe18;
      in_stack_fffffffffffffe40 = local_18;
      do {
        in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
        bVar8 = false;
        if (in_stack_fffffffffffffe40 < local_20) {
          bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe40]);
          bVar8 = bVar1 == bVar2;
        }
      } while (bVar8);
      in_stack_fffffffffffffe30 = local_20;
      local_1b8 = in_stack_fffffffffffffe40;
      if ((in_stack_fffffffffffffe40 < local_20) && (bVar1 < bVar2)) {
        while( true ) {
          in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
          bVar8 = false;
          if (in_stack_fffffffffffffe40 < local_20) {
            bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe40]);
            bVar8 = bVar1 <= bVar2;
          }
          if (!bVar8) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
            *in_stack_fffffffffffffe40 = *local_1b8;
            *local_1b8 = in_stack_fffffffffffffe18;
            local_1b8 = local_1b8 + 1;
          }
        }
      }
      do {
        in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
        bVar8 = false;
        if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe30) {
          bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe30]);
          bVar8 = bVar1 == bVar2;
        }
      } while (bVar8);
      in_stack_fffffffffffffe38 = in_stack_fffffffffffffe30;
      if ((in_stack_fffffffffffffe40 < in_stack_fffffffffffffe30) && (bVar2 < bVar1)) {
        while( true ) {
          in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 + -1;
          bVar8 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe38]);
            bVar8 = bVar2 <= bVar1;
          }
          if (!bVar8) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe38;
            *in_stack_fffffffffffffe38 = *in_stack_fffffffffffffe30;
            *in_stack_fffffffffffffe30 = in_stack_fffffffffffffe18;
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
          }
        }
      }
      while (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
        in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
        *in_stack_fffffffffffffe40 = *in_stack_fffffffffffffe38;
        *in_stack_fffffffffffffe38 = in_stack_fffffffffffffe18;
        while( true ) {
          in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
          bVar8 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe40]);
            bVar8 = bVar1 <= bVar2;
          }
          if (!bVar8) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
            *in_stack_fffffffffffffe40 = *local_1b8;
            *local_1b8 = in_stack_fffffffffffffe18;
            local_1b8 = local_1b8 + 1;
          }
        }
        while( true ) {
          in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 + -1;
          bVar8 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar4 + local_10[*in_stack_fffffffffffffe38]);
            bVar8 = bVar2 <= bVar1;
          }
          if (!bVar8) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe38;
            *in_stack_fffffffffffffe38 = *in_stack_fffffffffffffe30;
            *in_stack_fffffffffffffe30 = in_stack_fffffffffffffe18;
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
          }
        }
      }
      if (in_stack_fffffffffffffe30 < local_1b8) {
        iVar3 = iVar3 + 1;
        if (*(byte *)(lVar4 + (local_10[*local_18] + -1)) < bVar2) {
          local_18 = ss_partition(local_10,local_18,local_20,local_24);
          iVar3 = ss_ilg((int)((long)local_20 - (long)local_18 >> 2));
        }
        local_24 = local_24 + 1;
      }
      else {
        iVar6 = (int)((long)local_1b8 - (long)local_18 >> 2);
        iVar7 = (int)((long)in_stack_fffffffffffffe40 - (long)local_1b8 >> 2);
        if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
        piVar9 = in_stack_fffffffffffffe40 + -(long)iVar6;
        piVar5 = local_18;
        for (; 0 < iVar6; iVar6 = iVar6 + -1) {
          iVar7 = *piVar5;
          *piVar5 = *piVar9;
          *piVar9 = iVar7;
          piVar5 = piVar5 + 1;
          piVar9 = piVar9 + 1;
        }
        in_stack_fffffffffffffe1c =
             (int)((long)in_stack_fffffffffffffe30 - (long)(in_stack_fffffffffffffe40 + -1) >> 2);
        in_stack_fffffffffffffe18 =
             (int)((long)local_20 - (long)in_stack_fffffffffffffe30 >> 2) + -1;
        if (in_stack_fffffffffffffe18 < in_stack_fffffffffffffe1c) {
          in_stack_fffffffffffffe1c = in_stack_fffffffffffffe18;
        }
        in_stack_fffffffffffffe20 = local_20 + -(long)in_stack_fffffffffffffe1c;
        in_stack_fffffffffffffe28 = in_stack_fffffffffffffe40;
        for (; 0 < in_stack_fffffffffffffe1c;
            in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c + -1) {
          in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe28;
          *in_stack_fffffffffffffe28 = *in_stack_fffffffffffffe20;
          *in_stack_fffffffffffffe20 = in_stack_fffffffffffffe18;
          in_stack_fffffffffffffe28 = in_stack_fffffffffffffe28 + 1;
          in_stack_fffffffffffffe20 = in_stack_fffffffffffffe20 + 1;
        }
        piVar5 = local_18 + ((long)in_stack_fffffffffffffe40 - (long)local_1b8 >> 2);
        in_stack_fffffffffffffe38 =
             local_20 +
             -((long)in_stack_fffffffffffffe30 - (long)(in_stack_fffffffffffffe40 + -1) >> 2);
        local_208 = piVar5;
        if (*(byte *)(lVar4 + (local_10[*piVar5] + -1)) < bVar2) {
          local_208 = ss_partition(local_10,piVar5,in_stack_fffffffffffffe38,local_24);
        }
        if ((long)local_20 - (long)in_stack_fffffffffffffe38 >> 2 <
            (long)piVar5 - (long)local_18 >> 2) {
          if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
              (long)piVar5 - (long)local_18 >> 2) {
            if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
                (long)local_20 - (long)in_stack_fffffffffffffe38 >> 2) {
              if (0xf < depth_00) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb6c0,
                              "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                             );
              }
              local_1a8[(long)depth_00 * 3] = local_18;
              local_1a8[(long)depth_00 * 3 + 1] = piVar5;
              aiStack_198[(long)depth_00 * 6] = local_24;
              iVar6 = depth_00 + 1;
              aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
              if (0xf < iVar6) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb6c1,
                              "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                             );
              }
              local_1a8[(long)iVar6 * 3] = in_stack_fffffffffffffe38;
              local_1a8[(long)iVar6 * 3 + 1] = local_20;
              aiStack_198[(long)iVar6 * 6] = local_24;
              depth_00 = depth_00 + 2;
              aiStack_198[(long)iVar6 * 6 + 1] = iVar3;
              local_18 = local_208;
              local_24 = local_24 + 1;
              local_20 = in_stack_fffffffffffffe38;
              iVar3 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
              in_stack_fffffffffffffe40 = local_208;
            }
            else {
              if (0xf < depth_00) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb6bc,
                              "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                             );
              }
              local_1a8[(long)depth_00 * 3] = local_18;
              local_1a8[(long)depth_00 * 3 + 1] = piVar5;
              aiStack_198[(long)depth_00 * 6] = local_24;
              iVar6 = depth_00 + 1;
              aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
              if (0xf < iVar6) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb6bd,
                              "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                             );
              }
              local_1a8[(long)iVar6 * 3] = local_208;
              local_1a8[(long)iVar6 * 3 + 1] = in_stack_fffffffffffffe38;
              aiStack_198[(long)iVar6 * 6] = local_24 + 1;
              iVar7 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
              depth_00 = iVar6 + 1;
              aiStack_198[(long)iVar6 * 6 + 1] = iVar7;
              local_18 = in_stack_fffffffffffffe38;
              in_stack_fffffffffffffe40 = local_208;
            }
          }
          else {
            if (0xf < depth_00) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6b8,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)depth_00 * 3] = local_208;
            local_1a8[(long)depth_00 * 3 + 1] = in_stack_fffffffffffffe38;
            aiStack_198[(long)depth_00 * 6] = local_24 + 1;
            iVar6 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            iVar7 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = iVar6;
            if (0xf < iVar7) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6b9,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)iVar7 * 3] = local_18;
            local_1a8[(long)iVar7 * 3 + 1] = piVar5;
            aiStack_198[(long)iVar7 * 6] = local_24;
            depth_00 = depth_00 + 2;
            aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
            local_18 = in_stack_fffffffffffffe38;
            in_stack_fffffffffffffe40 = local_208;
          }
        }
        else if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
                 (long)local_20 - (long)in_stack_fffffffffffffe38 >> 2) {
          if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
              (long)piVar5 - (long)local_18 >> 2) {
            if (0xf < depth_00) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6b2,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)depth_00 * 3] = in_stack_fffffffffffffe38;
            local_1a8[(long)depth_00 * 3 + 1] = local_20;
            aiStack_198[(long)depth_00 * 6] = local_24;
            iVar6 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
            if (0xf < iVar6) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6b3,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)iVar6 * 3] = local_18;
            local_1a8[(long)iVar6 * 3 + 1] = piVar5;
            aiStack_198[(long)iVar6 * 6] = local_24;
            depth_00 = depth_00 + 2;
            aiStack_198[(long)iVar6 * 6 + 1] = iVar3;
            local_18 = local_208;
            local_24 = local_24 + 1;
            local_20 = in_stack_fffffffffffffe38;
            iVar3 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            in_stack_fffffffffffffe40 = local_208;
          }
          else {
            if (0xf < depth_00) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6ae,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)depth_00 * 3] = in_stack_fffffffffffffe38;
            local_1a8[(long)depth_00 * 3 + 1] = local_20;
            aiStack_198[(long)depth_00 * 6] = local_24;
            iVar6 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
            if (0xf < iVar6) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6af,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            local_1a8[(long)iVar6 * 3] = local_208;
            local_1a8[(long)iVar6 * 3 + 1] = in_stack_fffffffffffffe38;
            aiStack_198[(long)iVar6 * 6] = local_24 + 1;
            iVar7 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            depth_00 = iVar6 + 1;
            aiStack_198[(long)iVar6 * 6 + 1] = iVar7;
            local_20 = piVar5;
            in_stack_fffffffffffffe40 = local_208;
          }
        }
        else {
          if (0xf < depth_00) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6aa,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          local_1a8[(long)depth_00 * 3] = local_208;
          local_1a8[(long)depth_00 * 3 + 1] = in_stack_fffffffffffffe38;
          aiStack_198[(long)depth_00 * 6] = local_24 + 1;
          iVar6 = ss_ilg((int)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
          iVar7 = depth_00 + 1;
          aiStack_198[(long)depth_00 * 6 + 1] = iVar6;
          if (0xf < iVar7) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6ab,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          local_1a8[(long)iVar7 * 3] = in_stack_fffffffffffffe38;
          local_1a8[(long)iVar7 * 3 + 1] = local_20;
          aiStack_198[(long)iVar7 * 6] = local_24;
          depth_00 = depth_00 + 2;
          aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
          local_20 = piVar5;
          in_stack_fffffffffffffe40 = local_208;
        }
      }
    }
    local_1b8 = local_18;
    bVar2 = *(byte *)(lVar4 + local_10[*local_18]);
    while (local_1b8 = local_1b8 + 1, local_1b8 < local_20) {
      bVar1 = *(byte *)(lVar4 + local_10[*local_1b8]);
      if (bVar1 != bVar2) {
        if (1 < (long)local_1b8 - (long)local_18 >> 2) break;
        local_18 = local_1b8;
        bVar2 = bVar1;
      }
    }
    if (*(byte *)(lVar4 + (local_10[*local_18] + -1)) < bVar2) {
      local_18 = ss_partition(local_10,local_18,local_1b8,local_24);
    }
    if ((long)local_20 - (long)local_1b8 >> 2 < (long)local_1b8 - (long)local_18 >> 2) {
      if ((long)local_20 - (long)local_1b8 >> 2 < 2) {
        local_20 = local_1b8;
        local_24 = local_24 + 1;
        iVar3 = ss_ilg((int)((long)local_1b8 - (long)local_18 >> 2));
      }
      else {
        if (0xf < depth_00) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb678,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        local_1a8[(long)depth_00 * 3] = local_18;
        local_1a8[(long)depth_00 * 3 + 1] = local_1b8;
        aiStack_198[(long)depth_00 * 6] = local_24 + 1;
        iVar3 = ss_ilg((int)((long)local_1b8 - (long)local_18 >> 2));
        aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
        local_18 = local_1b8;
        iVar3 = -1;
        depth_00 = depth_00 + 1;
      }
    }
    else if ((long)local_1b8 - (long)local_18 >> 2 < 2) {
      local_18 = local_1b8;
      iVar3 = -1;
    }
    else {
      if (0xf < depth_00) {
        __assert_fail("ssize < STACK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb671,
                      "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)");
      }
      local_1a8[(long)depth_00 * 3] = local_1b8;
      local_1a8[(long)depth_00 * 3 + 1] = local_20;
      aiStack_198[(long)depth_00 * 6] = local_24;
      iVar6 = depth_00 + 1;
      aiStack_198[(long)depth_00 * 6 + 1] = -1;
      local_20 = local_1b8;
      local_24 = local_24 + 1;
      iVar3 = ss_ilg((int)((long)local_1b8 - (long)local_18 >> 2));
      depth_00 = iVar6;
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const unsigned char *T, const int *PA,
              int *first, int *last,
              int depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { int *a, *b, c; int d; } stack[STACK_SIZE];
  const unsigned char *Td;
  int *a, *b, *c, *d, *e, *f;
  int s, t;
  int ssize;
  int limit;
  int v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}